

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void do_cmd_quiver(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  object *local_28;
  
  local_28 = (object *)0x0;
  if (player->upkeep->quiver_cnt == L'\0') {
    msg("You have nothing in your quiver.");
    return;
  }
  player->upkeep->command_wrk = L'\b';
  screen_save();
  _Var1 = get_item(&local_28,"Select Item:","Error in do_cmd_quiver(), please report.",CMD_NULL,
                   (item_tester)0x0,L'Ɵ');
  if (_Var1) {
    do {
      screen_load();
      if ((local_28 != (object *)0x0) && (local_28->kind != (object_kind *)0x0)) {
        track_object(player->upkeep,local_28);
        _Var1 = player_is_shapechanged(player);
        if (_Var1) {
          player->upkeep->command_wrk = L'\b';
        }
        else {
          do {
            wVar2 = context_menu_object(local_28);
          } while (wVar2 == L'\x02');
          player->upkeep->command_wrk = L'\b';
          if (wVar2 != L'\x03') {
            return;
          }
        }
      }
      screen_save();
      _Var1 = get_item(&local_28,"Select Item:","Error in do_cmd_quiver(), please report.",CMD_NULL,
                       (item_tester)0x0,L'Ɵ');
    } while (_Var1);
  }
  screen_load();
  return;
}

Assistant:

void do_cmd_quiver(void)
{
	struct object *obj = NULL;
	int ret = 3;

	if (player->upkeep->quiver_cnt == 0) {
		msg("You have nothing in your quiver.");
		return;
	}

	/* Start in "quiver" mode */
	player->upkeep->command_wrk = (USE_QUIVER);

	/* Loop this menu until an object context menu says differently */
	while (ret == 3) {
		/* Save screen */
		screen_save();

		/* Get an item to use a context command on (Display the quiver) */
		if (get_item(&obj, "Select Item:",
				"Error in do_cmd_quiver(), please report.",
				CMD_NULL, NULL, GET_ITEM_PARAMS)) {
			/* Load screen */
			screen_load();

			if (obj && obj->kind) {
				/* Track the object */
				track_object(player->upkeep, obj);

				if (!player_is_shapechanged(player)) {
					while  ((ret = context_menu_object(obj)) == 2);
				}

				/* Stay in "quiver" mode */
				player->upkeep->command_wrk = (USE_QUIVER);
			}
		} else {
			/* Load screen */
			screen_load();

			ret = -1;
		}
	}
}